

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O0

void __thiscall DSDcc::DSDdPMR::processFS2(DSDdPMR *this,int symbolIndex,int dibit)

{
  bool bVar1;
  DSDLogger *this_00;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  double __x;
  SyncPattern patterns [2];
  DSDSync syncEngine;
  uint in_stack_ffffffffffffff84;
  SyncPattern *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  uchar *in_stack_ffffffffffffff98;
  DSDSync *in_stack_ffffffffffffffa0;
  
  if ((in_EDX == 0) || (in_EDX == 1)) {
    *(undefined1 *)((long)in_RDI + (long)in_ESI + 0x10) = 1;
  }
  else {
    *(undefined1 *)((long)in_RDI + (long)in_ESI + 0x10) = 3;
  }
  if (in_ESI == 0xb) {
    DSDSync::matchSome(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94
                       ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    bVar1 = DSDSync::isMatching((DSDSync *)&stack0xffffffffffffff84,SyncDPMRFS2);
    if (bVar1) {
      *(undefined4 *)((long)in_RDI + 0xc) = 3;
    }
    else {
      bVar1 = DSDSync::isMatching((DSDSync *)&stack0xffffffffffffff84,SyncDPMRFS3);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 1) = 4;
        *(undefined4 *)(in_RDI + 7) = 0;
      }
      else {
        this_00 = DSDDecoder::getLogger((DSDDecoder *)*in_RDI);
        DSDLogger::log(this_00,__x);
        *(undefined4 *)((long)in_RDI + 0xc) = 1;
        *(undefined4 *)(in_RDI + 1) = 2;
        *(undefined4 *)(in_RDI + 7) = 0;
        *(undefined4 *)((long)in_RDI + 0x34) = 0;
      }
    }
  }
  return;
}

Assistant:

void DSDdPMR::processFS2(int symbolIndex, int dibit)
{
    if ((dibit == 0) || (dibit == 1)) // positives (+1 or +3) => store 1 which maps to +3
    {
        m_syncDoubleBuffer[symbolIndex] = 1;
    }
    else
    {
        m_syncDoubleBuffer[symbolIndex] = 3;
    }

    if (symbolIndex == 11) // last symbol
    {
        DSDSync syncEngine;
        const DSDSync::SyncPattern patterns[2] = { DSDSync::SyncDPMRFS2, DSDSync::SyncDPMRFS3 };
        syncEngine.matchSome(m_syncDoubleBuffer, 12, patterns, 2);

        if (syncEngine.isMatching(DSDSync::SyncDPMRFS2)) // start of superframes
        {
            // nothing
            m_frameType = DPMRPayloadFrame;
        }
        else if (syncEngine.isMatching(DSDSync::SyncDPMRFS3)) // end frame
        {
            m_state = DPMREnd;
            m_symbolIndex = 0;
        }
        else
        {
            m_dsdDecoder->getLogger().log("DSDdPMR::processFS2: start extensive sync search\n"); // DEBUG
            m_frameType = DPMRExtSearchFrame;
            m_state = DPMRExtSearch;
            m_symbolIndex = 0;
            m_syncCycle = 0;
        }
    }
}